

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void Internal_ON_Mesh_IsCorruptMessage
               (bool bSilentError,bool *bIsCorrupt,ON_TextLog *text_log,
               wchar_t *corruption_description)

{
  if (*bIsCorrupt == false) {
    if (!bSilentError) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x39c,"","ON_Mesh data is corrupt.");
    }
    *bIsCorrupt = true;
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::PrintString(text_log,corruption_description);
      return;
    }
  }
  return;
}

Assistant:

static void Internal_ON_Mesh_IsCorruptMessage(
  bool bSilentError,
  bool& bIsCorrupt,
  ON_TextLog* text_log,
  const wchar_t* corruption_description
)
{
  if (false == bIsCorrupt)
  {
    if (false == bSilentError)
    {
      ON_ERROR("ON_Mesh data is corrupt.");
    }
    bIsCorrupt = true;
    if (nullptr != text_log)
      text_log->PrintString(corruption_description);
  }
}